

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_TEXM3X2TEX(Context *ctx)

{
  int iVar1;
  RegisterList *pRVar2;
  
  iVar1 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar1 != 0) {
    fail(ctx,"TEXM3X2TEX opcode not available after Shader Model 1.3");
  }
  if (ctx->texm3x2pad_dst0 == -1) {
    fail(ctx,"TEXM3X2TEX opcode without matching TEXM3X2PAD");
  }
  state_texops(ctx,"TEXM3X2TEX",2,0);
  ctx->reset_texmpad = 1;
  pRVar2 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
  if ((pRVar2 != (RegisterList *)0x0) && (pRVar2->index == 2)) {
    return;
  }
  fail(ctx,"TEXM3X2TEX needs a 2D sampler");
  return;
}

Assistant:

static void state_TEXM3X2TEX(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2TEX opcode not available after Shader Model 1.3");
    if (ctx->texm3x2pad_dst0 == -1)
        fail(ctx, "TEXM3X2TEX opcode without matching TEXM3X2PAD");
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    state_texops(ctx, "TEXM3X2TEX", 2, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if (ttype != TEXTURE_TYPE_2D)
        fail(ctx, "TEXM3X2TEX needs a 2D sampler");
}